

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O0

int Fra_ClassesCountPairs(Fra_Cla_t *p)

{
  int iVar1;
  Aig_Obj_t **pClass_00;
  int local_24;
  int nPairs;
  int nNodes;
  int i;
  Aig_Obj_t **pClass;
  Fra_Cla_t *p_local;
  
  local_24 = 0;
  nPairs = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p->vClasses);
    if (iVar1 <= nPairs) {
      return local_24;
    }
    pClass_00 = (Aig_Obj_t **)Vec_PtrEntry(p->vClasses,nPairs);
    iVar1 = Fra_ClassCount(pClass_00);
    if (iVar1 < 2) break;
    local_24 = (iVar1 * (iVar1 + -1)) / 2 + local_24;
    nPairs = nPairs + 1;
  }
  __assert_fail("nNodes > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClass.c"
                ,0xc4,"int Fra_ClassesCountPairs(Fra_Cla_t *)");
}

Assistant:

int Fra_ClassesCountPairs( Fra_Cla_t * p )
{
    Aig_Obj_t ** pClass;
    int i, nNodes, nPairs = 0;
    Vec_PtrForEachEntry( Aig_Obj_t **, p->vClasses, pClass, i )
    {
        nNodes = Fra_ClassCount( pClass );
        assert( nNodes > 1 );
        nPairs += nNodes * (nNodes - 1) / 2;
    }
    return nPairs;
}